

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_LdArrFunc<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  *(undefined8 *)(*(long *)(this + 0x120) + (ulong)playout->Value * 8) =
       *(undefined8 *)
        (*(long *)(*(long *)(this + 0x120) + (ulong)playout->Instance * 8) +
        (ulong)*(uint *)(*(long *)(this + 0x118) + (ulong)playout->SlotIndex * 4) * 8);
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdArrFunc(const unaligned T* playout)
    {
        Var* arr = (Var*)GetRegRawPtr(playout->Instance);
        const uint32 index = (uint32)GetRegRawInt(playout->SlotIndex);
        SetRegRawPtr(playout->Value, arr[index]);
    }